

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

void RestartModel(CPpmd8 *p)

{
  Byte *pBVar1;
  ushort uVar2;
  uint uVar3;
  Byte *pBVar4;
  ulong uVar5;
  Byte *pBVar6;
  UInt16 (*paUVar7) [64];
  uint uVar8;
  int iVar9;
  int iVar10;
  CPpmd8_Context *pCVar11;
  ulong uVar12;
  long lVar13;
  CPpmd_State *pCVar14;
  uint uVar15;
  UInt16 (*paUVar16) [64];
  long lVar17;
  
  lVar17 = 0;
  memset(p->FreeList,0,0x130);
  pBVar4 = p->Base;
  uVar15 = p->AlignOffset;
  pBVar6 = pBVar4 + uVar15;
  p->Text = pBVar6;
  uVar3 = p->MaxOrder;
  uVar5 = (ulong)p->Size;
  uVar12 = (ulong)((p->Size / 0x60) * 0x54);
  pCVar14 = (CPpmd_State *)(pBVar6 + (uVar5 - uVar12));
  p->UnitsStart = (Byte *)pCVar14;
  p->GlueCount = 0;
  p->OrderFall = uVar3;
  uVar8 = 0xc;
  if (uVar3 < 0xc) {
    uVar8 = uVar3;
  }
  p->InitRL = ~uVar8;
  p->RunLength = ~uVar8;
  p->PrevSuccess = 0;
  pCVar11 = (CPpmd8_Context *)(pBVar6 + (uVar5 - 0xc));
  p->HiUnit = (Byte *)pCVar11;
  p->MaxContext = pCVar11;
  p->MinContext = pCVar11;
  pBVar1 = pBVar6 + (uVar5 - 4);
  pBVar1[0] = '\0';
  pBVar1[1] = '\0';
  pBVar1[2] = '\0';
  pBVar1[3] = '\0';
  pCVar11->NumStats = 0xff;
  pCVar11->Flags = '\0';
  pCVar11->SummFreq = 0x101;
  p->FoundState = pCVar14;
  p->LoUnit = &pCVar14[0x100].Symbol;
  *(int *)(pBVar6 + (uVar5 - 8)) = (int)pCVar14 - (int)pBVar4;
  pBVar4 = pBVar4 + ((uVar5 + uVar15) - uVar12) + 4;
  for (; lVar17 != 0x100; lVar17 = lVar17 + 1) {
    pBVar4[-4] = (Byte)lVar17;
    pBVar4[-3] = '\x01';
    pBVar4[-2] = '\0';
    pBVar4[-1] = '\0';
    pBVar4[0] = '\0';
    pBVar4[1] = '\0';
    pBVar4 = pBVar4 + 6;
  }
  paUVar7 = p->BinSumm;
  uVar15 = 0;
  for (uVar12 = 0; uVar3 = uVar15, uVar12 != 0x19; uVar12 = uVar12 + 1) {
    do {
      uVar15 = uVar3;
      uVar3 = uVar15 + 1;
    } while (uVar12 == p->NS2Indx[uVar15]);
    paUVar16 = paUVar7;
    for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
      uVar2 = kInitBinEsc[lVar17];
      for (uVar5 = 0; uVar5 < 0x40; uVar5 = uVar5 + 8) {
        (*paUVar16)[uVar5] = 0x4000 - (short)((uint)uVar2 / (uVar15 + 1));
      }
      paUVar16 = (UInt16 (*) [64])(*paUVar16 + 1);
    }
    paUVar7 = paUVar7 + 1;
  }
  pBVar6 = &p->See[0][0].Count;
  iVar10 = 0;
  for (lVar17 = 0; lVar17 != 0x18; lVar17 = lVar17 + 1) {
    iVar9 = iVar10 * 0x10 + 0x18;
    iVar10 = iVar10 + -1;
    do {
      uVar15 = iVar10 + 4;
      iVar10 = iVar10 + 1;
      iVar9 = iVar9 + 0x10;
    } while (lVar17 + 3U == (ulong)p->NS2Indx[uVar15]);
    for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
      *(undefined2 *)(pBVar6 + lVar13 * 4 + -1) = 0x703;
      *(short *)(pBVar6 + lVar13 * 4 + -3) = (short)iVar9;
    }
    pBVar6 = pBVar6 + 0x80;
  }
  return;
}

Assistant:

static void RestartModel(CPpmd8 *p)
{
  unsigned i, k, m, r;

  memset(p->FreeList, 0, sizeof(p->FreeList));
  memset(p->Stamps, 0, sizeof(p->Stamps));
  RESET_TEXT(0);
  p->HiUnit = p->Text + p->Size;
  p->LoUnit = p->UnitsStart = p->HiUnit - p->Size / 8 / UNIT_SIZE * 7 * UNIT_SIZE;
  p->GlueCount = 0;

  p->OrderFall = p->MaxOrder;
  p->RunLength = p->InitRL = -(Int32)((p->MaxOrder < 12) ? p->MaxOrder : 12) - 1;
  p->PrevSuccess = 0;

  p->MinContext = p->MaxContext = (CTX_PTR)(p->HiUnit -= UNIT_SIZE); /* AllocContext(p); */
  p->MinContext->Suffix = 0;
  p->MinContext->NumStats = 255;
  p->MinContext->Flags = 0;
  p->MinContext->SummFreq = 256 + 1;
  p->FoundState = (CPpmd_State *)p->LoUnit; /* AllocUnits(p, PPMD_NUM_INDEXES - 1); */
  p->LoUnit += U2B(256 / 2);
  p->MinContext->Stats = REF(p->FoundState);
  for (i = 0; i < 256; i++)
  {
    CPpmd_State *s = &p->FoundState[i];
    s->Symbol = (Byte)i;
    s->Freq = 1;
    SetSuccessor(s, 0);
  }

  for (i = m = 0; m < 25; m++)
  {
    while (p->NS2Indx[i] == m)
      i++;
    for (k = 0; k < 8; k++)
    {
      UInt16 val = (UInt16)(PPMD_BIN_SCALE - kInitBinEsc[k] / (i + 1));
      UInt16 *dest = p->BinSumm[m] + k;
      for (r = 0; r < 64; r += 8)
        dest[r] = val;
    }
  }

  for (i = m = 0; m < 24; m++)
  {
    while (p->NS2Indx[i + 3] == m + 3)
      i++;
    for (k = 0; k < 32; k++)
    {
      CPpmd_See *s = &p->See[m][k];
      s->Summ = (UInt16)((2 * i + 5) << (s->Shift = PPMD_PERIOD_BITS - 4));
      s->Count = 7;
    }
  }
}